

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O2

int __thiscall Fl_Input_::replace(Fl_Input_ *this,int b,int e,char *text,int ilen)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  int __c;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar11;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  int iVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  int iVar16;
  ulong uVar17;
  long local_50;
  
  was_up_down = 0;
  if (b < 1) {
    b = 0;
  }
  uVar6 = 0;
  if (0 < e) {
    uVar6 = e;
  }
  uVar7 = this->size_;
  if ((int)uVar7 <= b) {
    b = uVar7;
  }
  uVar2 = uVar7;
  if ((int)uVar6 < (int)uVar7) {
    uVar2 = uVar6;
  }
  uVar3 = uVar2;
  if ((int)uVar6 < b) {
    uVar3 = b;
  }
  uVar14 = (ulong)uVar3;
  uVar17 = (ulong)uVar2;
  if (b <= (int)uVar6) {
    uVar17 = (ulong)(uint)b;
  }
  while ((((iVar16 = (int)uVar17, uVar17 != uVar14 && (0 < iVar16)) && (iVar16 < (int)uVar7)) &&
         (iVar5 = fl_utf8len(this->value_[uVar17]), iVar5 < 1))) {
    uVar17 = uVar17 - 1;
    uVar7 = this->size_;
  }
  iVar5 = fl_utf8len(this->value_[(int)uVar3]);
  local_50 = uVar14 << 0x20;
  while( true ) {
    iVar13 = this->size_;
    iVar12 = (int)uVar14;
    if ((((int)uVar3 < 1) || (iVar13 <= iVar12)) || (-1 < iVar5)) break;
    lVar4 = uVar14 + 1;
    uVar14 = uVar14 + 1;
    iVar5 = fl_utf8len(this->value_[lVar4]);
    local_50 = local_50 + 0x100000000;
  }
  if (ilen == 0 && text != (char *)0x0) {
    sVar8 = strlen(text);
    ilen = (int)sVar8;
  }
  if (ilen == 0 && iVar12 <= iVar16) {
    return 0;
  }
  iVar5 = 0;
  pcVar15 = this->value_;
  for (pcVar9 = pcVar15; pcVar9 < pcVar15 + iVar13; pcVar9 = pcVar9 + uVar14) {
    if (pcVar15 + iVar16 == pcVar9) {
      if (iVar13 <= iVar12) break;
      pcVar9 = pcVar15 + (local_50 >> 0x20);
    }
    uVar6 = fl_utf8len(*pcVar9);
    uVar14 = (ulong)uVar6;
    if ((int)uVar6 < 2) {
      uVar14 = 1;
    }
    iVar5 = iVar5 + 1;
    pcVar15 = this->value_;
    iVar13 = this->size_;
  }
  uVar6 = 0;
  pcVar15 = text;
  for (; (pcVar15 < text + ilen && (iVar5 < this->maximum_size_)); iVar5 = iVar5 + 1) {
    uVar7 = fl_utf8len(*pcVar15);
    uVar14 = (ulong)uVar7;
    if ((int)uVar7 < 2) {
      uVar14 = 1;
    }
    pcVar15 = pcVar15 + uVar14;
    uVar6 = (int)uVar14 + uVar6;
  }
  put_in_buffer(this,this->size_ + uVar6);
  uVar11 = extraout_RDX;
  if (iVar16 < iVar12) {
    if ((undowidget == this) && (iVar16 == undoat)) {
      undobuffersize((undocut - iVar16) + iVar12);
      iVar5 = undocut;
      memcpy(undobuffer + undocut,this->value_ + iVar16,(long)(iVar12 - iVar16));
      undocut = (iVar5 - iVar16) + iVar12;
    }
    else if (undowidget == this) {
      if (undoat == iVar12 && undoinsert == 0) {
        undobuffersize((undocut - iVar16) + iVar12);
        pcVar15 = undobuffer;
        iVar5 = undocut;
        memmove(undobuffer + (iVar12 - iVar16),undobuffer,(long)undocut);
        memcpy(pcVar15,this->value_ + iVar16,(long)(iVar12 - iVar16));
        undocut = (iVar5 - iVar16) + iVar12;
      }
      else {
        if ((undoat != iVar12) || (undoinsert <= iVar12 - iVar16)) goto LAB_00186502;
        undoinsert = (undoinsert + iVar16) - iVar12;
      }
    }
    else {
LAB_00186502:
      iVar5 = iVar12 - iVar16;
      undobuffersize(iVar5);
      memcpy(undobuffer,this->value_ + iVar16,(long)iVar5);
      undoinsert = 0;
      undocut = iVar5;
    }
    memmove(this->buffer + iVar16,this->buffer + (local_50 >> 0x20),
            (long)((this->size_ - iVar12) + 1));
    this->size_ = (iVar16 + this->size_) - iVar12;
    yankcut = 0;
    uVar11 = extraout_RDX_00;
    undowidget = this;
    undoat = iVar16;
    if (((this->super_Fl_Widget).type_ & 7) != 5) {
      yankcut = undocut;
    }
  }
  uVar14 = (ulong)uVar6;
  if (uVar6 != 0) {
    if ((undowidget == this) && (iVar16 == undoat)) {
      undoinsert = undoinsert + uVar6;
    }
    else {
      undocut = 0;
      undoinsert = uVar6;
    }
    memmove(this->buffer + iVar16 + uVar14,this->buffer + iVar16,(long)((this->size_ - iVar16) + 1))
    ;
    memcpy(this->buffer + iVar16,text,uVar14);
    this->size_ = this->size_ + uVar6;
    uVar11 = extraout_RDX_01;
  }
  iVar5 = this->position_;
  iVar13 = this->mark_;
  iVar12 = uVar6 + iVar16;
  undowidget = this;
  undoat = iVar12;
  this->position_ = iVar12;
  this->mark_ = iVar12;
  if (((this->super_Fl_Widget).type_ & 0x10) != 0) {
    for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
      if (text[uVar10] == ' ') {
        if (uVar6 != (uint)uVar10) goto LAB_00186664;
        break;
      }
    }
    do {
      iVar16 = (int)uVar17;
      if (iVar16 < 1) break;
      pcVar15 = index(this,(char *)(uVar17 & 0xffffffff),(int)uVar11);
      iVar12 = isspace((uint)pcVar15 & 0xff);
      if ((iVar12 != 0) ||
         (pcVar15 = index(this,(char *)(uVar17 & 0xffffffff),__c), (int)pcVar15 == 10)) break;
      uVar17 = (ulong)(iVar16 - 1);
      uVar11 = extraout_RDX_03;
    } while( true );
  }
LAB_001866ad:
  if (iVar13 < iVar16) {
    iVar16 = iVar13;
  }
  if (iVar5 < iVar16) {
    iVar16 = iVar5;
  }
  minimal_update(this,iVar16);
  iVar16 = undoat;
  this->position_ = undoat;
  this->mark_ = iVar16;
  puVar1 = &(this->super_Fl_Widget).flags_;
  *(byte *)puVar1 = (byte)*puVar1 | 0x80;
  if (((this->super_Fl_Widget).when_ & 1) != 0) {
    Fl_Widget::do_callback(&this->super_Fl_Widget);
  }
  return 1;
LAB_00186664:
  while ((iVar16 = (int)uVar17, 0 < iVar16 &&
         (pcVar15 = index(this,(char *)(uVar17 & 0xffffffff),(int)uVar11), (int)pcVar15 != 10))) {
    uVar17 = (ulong)(iVar16 - 1);
    uVar11 = extraout_RDX_02;
  }
  goto LAB_001866ad;
}

Assistant:

int Fl_Input_::replace(int b, int e, const char* text, int ilen) {
  int ul, om, op;
  was_up_down = 0;

  if (b<0) b = 0;
  if (e<0) e = 0;
  if (b>size_) b = size_;
  if (e>size_) e = size_;
  if (e<b) {int t=b; b=e; e=t;}
  while (b != e && b > 0 && (size_ - b) > 0 &&
       (fl_utf8len((value_ + b)[0]) < 1)) { b--; }
  ul = fl_utf8len((char)(value_ + e)[0]);
  while (e < size_ && e > 0 && ul < 0) {
       e++;
       ul = fl_utf8len((char)(value_ + e)[0]);
  }
  if (text && !ilen) ilen = (int) strlen(text);
  if (e<=b && !ilen) return 0; // don't clobber undo for a null operation

  // we must count UTF-8 *characters* to determine whether we can insert
  // the full text or only a part of it (and how much this would be)

  int nchars = 0;	// characters in value() - deleted + inserted
  const char *p = value_;
  while (p < (char *)(value_+size_)) {
    if (p == (char *)(value_+b)) { // skip removed part
      p = (char *)(value_+e);
      if (p >= (char *)(value_+size_)) break;
    }
    int ulen = fl_utf8len(*p);
    if (ulen < 1) ulen = 1; // invalid UTF-8 character: count as 1
    nchars++;
    p += ulen;
  }
  int nlen = 0;		// length (in bytes) to be inserted
  p = text;
  while (p < (char *)(text+ilen) && nchars < maximum_size()) {
    int ulen = fl_utf8len(*p);
    if (ulen < 1) ulen = 1; // invalid UTF-8 character: count as 1
    nchars++;
    p += ulen;
    nlen += ulen;
  }
  ilen = nlen;

  put_in_buffer(size_+ilen);

  if (e>b) {
    if (undowidget == this && b == undoat) {
      undobuffersize(undocut+(e-b));
      memcpy(undobuffer+undocut, value_+b, e-b);
      undocut += e-b;
    } else if (undowidget == this && e == undoat && !undoinsert) {
      undobuffersize(undocut+(e-b));
      memmove(undobuffer+(e-b), undobuffer, undocut);
      memcpy(undobuffer, value_+b, e-b);
      undocut += e-b;
    } else if (undowidget == this && e == undoat && (e-b)<undoinsert) {
      undoinsert -= e-b;
    } else {
      undobuffersize(e-b);
      memcpy(undobuffer, value_+b, e-b);
      undocut = e-b;
      undoinsert = 0;
    }
    memmove(buffer+b, buffer+e, size_-e+1);
    size_ -= e-b;
    undowidget = this;
    undoat = b;
    if (input_type() == FL_SECRET_INPUT) yankcut = 0; else yankcut = undocut;
  }

  if (ilen) {
    if (undowidget == this && b == undoat)
      undoinsert += ilen;
    else {
      undocut = 0;
      undoinsert = ilen;
    }
    memmove(buffer+b+ilen, buffer+b, size_-b+1);
    memcpy(buffer+b, text, ilen);
    size_ += ilen;
  }
  undowidget = this;
  om = mark_;
  op = position_;
  mark_ = position_ = undoat = b+ilen;

  // Insertions into the word at the end of the line will cause it to
  // wrap to the next line, so we must indicate that the changes may start
  // right after the whitespace before the current word.  This will
  // result in sub-optimal update when such wrapping does not happen
  // but it is too hard to figure out for now...
  if (wrap()) {
    // if there is a space in the pasted text, the whole line may have rewrapped
    int i;
    for (i=0; i<ilen; i++)
      if (text[i]==' ') break;
    if (i==ilen)
      while (b > 0 && !isspace(index(b) & 255) && index(b)!='\n') b--;
    else
      while (b > 0 && index(b)!='\n') b--;
  }

  // make sure we redraw the old selection or cursor:
  if (om < b) b = om;
  if (op < b) b = op;

  minimal_update(b);

  mark_ = position_ = undoat;

  set_changed();
  if (when()&FL_WHEN_CHANGED) do_callback();
  return 1;
}